

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindow * ImGui::NavRestoreLastChildNavWindow(ImGuiWindow *window)

{
  ImGuiTabItem *pIVar1;
  ImGuiWindow *in_RDI;
  ImGuiTabItem *tab;
  ImGuiWindow *local_8;
  
  if ((in_RDI->NavLastChildNavWindow == (ImGuiWindow *)0x0) ||
     ((in_RDI->NavLastChildNavWindow->WasActive & 1U) == 0)) {
    local_8 = in_RDI;
    if ((in_RDI->DockNodeAsHost != (ImGuiDockNode *)0x0) &&
       ((in_RDI->DockNodeAsHost->TabBar != (ImGuiTabBar *)0x0 &&
        (pIVar1 = TabBarFindMostRecentlySelectedTabForActiveWindow((ImGuiTabBar *)tab),
        pIVar1 != (ImGuiTabItem *)0x0)))) {
      local_8 = pIVar1->Window;
    }
  }
  else {
    local_8 = in_RDI->NavLastChildNavWindow;
  }
  return local_8;
}

Assistant:

static ImGuiWindow* ImGui::NavRestoreLastChildNavWindow(ImGuiWindow* window)
{
    if (window->NavLastChildNavWindow && window->NavLastChildNavWindow->WasActive)
        return window->NavLastChildNavWindow;
    if (window->DockNodeAsHost && window->DockNodeAsHost->TabBar)
        if (ImGuiTabItem* tab = TabBarFindMostRecentlySelectedTabForActiveWindow(window->DockNodeAsHost->TabBar))
            return tab->Window;
    return window;
}